

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,6u>::small_vector_base<6u>
          (small_vector_base<std::allocator<mp::LinearExpr::Term>,6u> *this,long *param_2)

{
  ulong __n;
  Term *__dest;
  void *__src;
  
  __n = param_2[2];
  if (__n < 7) {
    *(undefined8 *)(this + 8) = 6;
    __dest = (Term *)(this + 0x18);
    *(Term **)this = __dest;
    if (__n == 0) goto LAB_00453485;
    __src = (void *)*param_2;
  }
  else {
    __dest = __gnu_cxx::new_allocator<mp::LinearExpr::Term>::allocate
                       ((new_allocator<mp::LinearExpr::Term> *)this,__n,
                        (void *)(param_2[1] * 0x10 + *param_2));
    *(Term **)this = __dest;
    __n = param_2[2];
    *(ulong *)(this + 8) = __n;
    if (__n == 0) goto LAB_00453485;
    __src = (void *)*param_2;
  }
  memcpy(__dest,__src,__n << 4);
LAB_00453485:
  *(long *)(this + 0x10) = param_2[2];
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR
      small_vector_base (bypass_tag,
                         const small_vector_base<Allocator, I>& other,
                         const MaybeAlloc&... alloc)
        : alloc_interface (other, alloc...)
      {
        if (InlineCapacity < other.get_size ())
        {
          set_data_ptr (unchecked_allocate (other.get_size (), other.allocation_end_ptr ()));
          set_capacity (other.get_size ());

          GCH_TRY
          {
            uninitialized_copy (other.begin_ptr (), other.end_ptr (), data_ptr ());
          }
          GCH_CATCH (...)
          {
            deallocate (data_ptr (), get_capacity ());
            GCH_THROW;
          }
        }